

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

sqlite3_int64 sqlite3_uri_int64(char *zFilename,char *zParam,sqlite3_int64 bDflt)

{
  int iVar1;
  char *z;
  long in_FS_OFFSET;
  undefined1 *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  z = sqlite3_uri_parameter(zFilename,zParam);
  if (z != (char *)0x0) {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    iVar1 = sqlite3DecOrHexToI64(z,(i64 *)&local_18);
    if (iVar1 == 0) {
      bDflt = (sqlite3_int64)local_18;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return (sqlite3_int64)(undefined1 *)bDflt;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_API sqlite3_int64 sqlite3_uri_int64(
  const char *zFilename,    /* Filename as passed to xOpen */
  const char *zParam,       /* URI parameter sought */
  sqlite3_int64 bDflt       /* return if parameter is missing */
){
  const char *z = sqlite3_uri_parameter(zFilename, zParam);
  sqlite3_int64 v;
  if( z && sqlite3DecOrHexToI64(z, &v)==0 ){
    bDflt = v;
  }
  return bDflt;
}